

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this)

{
  Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_local;
  
  kj::_::NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
            (&this->ptr,(void *)0x0);
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }